

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O1

void __thiscall pg::QPTSolver::run(QPTSolver *this)

{
  Game *pGVar1;
  size_t sVar2;
  bool bVar3;
  unsigned_long uVar4;
  int iVar5;
  ostream *poVar6;
  long *plVar7;
  ulong uVar8;
  int *piVar9;
  uint *puVar10;
  size_t sVar11;
  uint uVar12;
  long lVar13;
  char *pcVar14;
  long lVar15;
  uint uVar16;
  int max1;
  int max0;
  int k1;
  int k0;
  unsigned_long goal1;
  unsigned_long goal0;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  ulong local_68;
  unsigned_long local_60;
  unsigned_long local_58;
  long local_50;
  long local_48;
  size_t local_40;
  long local_38;
  
  updateState(this,&local_58,&local_60,&local_78,&local_7c,&local_70,&local_74);
  poVar6 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"for odd with even measures: n0=",0x1f);
  uVar4 = local_58;
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", k=",4);
  plVar7 = (long *)std::ostream::operator<<(poVar6,local_70);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  poVar6 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"for even with odd measures: n1=",0x1f);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", k=",4);
  iVar5 = local_74;
  plVar7 = (long *)std::ostream::operator<<(poVar6,local_74);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  local_6c = iVar5;
  if (iVar5 < local_70) {
    local_6c = local_70;
  }
  pGVar1 = (this->super_Solver).game;
  uVar8 = (long)local_6c * pGVar1->n_vertices;
  piVar9 = (int *)operator_new__(-(ulong)(uVar8 >> 0x3e != 0) | uVar8 * 4);
  this->pm_nodes = piVar9;
  piVar9 = (int *)operator_new__(-(ulong)((ulong)pGVar1->n_vertices >> 0x3e != 0) |
                                 pGVar1->n_vertices << 2);
  this->strategy = piVar9;
  uVar8 = pGVar1->n_vertices;
  (this->todo).pointer = 0;
  puVar10 = (this->todo).queue;
  if (puVar10 != (uint *)0x0) {
    operator_delete__(puVar10);
  }
  puVar10 = (uint *)operator_new__((uVar8 & 0xffffffff) << 2);
  (this->todo).queue = puVar10;
  bitset::resize(&this->dirty,((this->super_Solver).game)->n_vertices);
  this->lift_count = 0;
  this->lift_attempt = 0;
  if (this->bounded == true) {
    if (local_6c < 1) {
      uVar16 = 1;
    }
    else {
      uVar8 = 1;
      do {
        pGVar1 = (this->super_Solver).game;
        local_38 = this->lift_count;
        local_50 = this->lift_attempt;
        local_48 = pGVar1->n_vertices;
        local_40 = bitset::count(&pGVar1->solved);
        this->pl = 0;
        this->k = (int)uVar8;
        this->max = local_78;
        iVar5 = local_7c;
        if (local_7c == -1) {
          iVar5 = 0;
        }
        this->maxo = iVar5;
        this->goal = local_58;
        local_68 = uVar8;
        liftloop(this);
        pGVar1 = (this->super_Solver).game;
        sVar2 = pGVar1->n_vertices;
        sVar11 = bitset::count(&pGVar1->solved);
        poVar6 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"after even with k=",0x12);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->k);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
        *(undefined8 *)(&poVar6->field_0x10 + (long)poVar6->_vptr_basic_ostream[-3]) = 9;
        poVar6 = std::ostream::_M_insert<long>((long)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," lifts, ",8);
        *(undefined8 *)(&poVar6->field_0x10 + (long)poVar6->_vptr_basic_ostream[-3]) = 9;
        poVar6 = std::ostream::_M_insert<long>((long)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," lift attempts, ",0x10);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," unsolved left.",0xf);
        std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        if (sVar2 == sVar11) {
LAB_0016a587:
          bVar3 = false;
          uVar12 = (uint)local_68;
        }
        else {
          local_48 = local_48 - local_40;
          if (sVar2 - sVar11 != local_48) {
            updateState(this,&local_58,&local_60,&local_78,&local_7c,&local_70,&local_74);
          }
          local_50 = this->lift_attempt;
          this->pl = 1;
          this->k = (int)local_68;
          this->max = local_7c;
          iVar5 = local_78;
          if (local_78 == -1) {
            iVar5 = 1;
          }
          this->maxo = iVar5;
          this->goal = local_60;
          liftloop(this);
          pGVar1 = (this->super_Solver).game;
          sVar2 = pGVar1->n_vertices;
          sVar11 = bitset::count(&pGVar1->solved);
          poVar6 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"after odd  with k=",0x12);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->k);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
          *(undefined8 *)(&poVar6->field_0x10 + (long)poVar6->_vptr_basic_ostream[-3]) = 9;
          poVar6 = std::ostream::_M_insert<long>((long)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," lifts, ",8);
          *(undefined8 *)(&poVar6->field_0x10 + (long)poVar6->_vptr_basic_ostream[-3]) = 9;
          poVar6 = std::ostream::_M_insert<long>((long)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," lift attempts, ",0x10);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," unsolved left.",0xf);
          std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          lVar13 = local_48;
          lVar15 = sVar2 - sVar11;
          if (sVar2 == sVar11) goto LAB_0016a587;
          if (lVar15 != local_48) {
            updateState(this,&local_58,&local_60,&local_78,&local_7c,&local_70,&local_74);
          }
          uVar12 = (int)local_68 - (uint)(lVar15 != lVar13);
          bVar3 = true;
        }
        uVar16 = uVar12;
        if (!bVar3) break;
        uVar16 = uVar12 + 1;
        uVar8 = (ulong)uVar16;
      } while ((int)uVar12 < local_6c);
    }
    poVar6 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"solved with ",0xc);
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," lifts, ",8);
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," lift attempts, max k ",0x16);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar16);
    pcVar14 = ".";
    lVar13 = 1;
  }
  else {
    this->pl = 0;
    this->k = local_70;
    this->max = local_78;
    iVar5 = local_7c;
    if (local_7c == -1) {
      iVar5 = 0;
    }
    this->maxo = iVar5;
    this->goal = uVar4;
    liftloop(this);
    pGVar1 = (this->super_Solver).game;
    sVar2 = pGVar1->n_vertices;
    sVar11 = bitset::count(&pGVar1->solved);
    poVar6 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"after even, ",0xc);
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," lifts, ",8);
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," lift attempts, ",0x10);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," unsolved left.",0xf);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if (sVar2 != sVar11) {
      updateState(this,&local_58,&local_60,&local_78,&local_7c,&local_70,&local_74);
      this->pl = 1;
      this->k = local_74;
      this->max = local_7c;
      if (local_78 == -1) {
        local_78 = 1;
      }
      this->maxo = local_78;
      this->goal = local_60;
      liftloop(this);
    }
    poVar6 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"solved with ",0xc);
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," lifts, ",8);
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
    pcVar14 = " lift attempts.";
    lVar13 = 0xf;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar14,lVar13);
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (this->pm_nodes != (int *)0x0) {
    operator_delete__(this->pm_nodes);
  }
  if (this->strategy == (int *)0x0) {
    return;
  }
  operator_delete__(this->strategy);
  return;
}

Assistant:

void
QPTSolver::run()
{
    unsigned long goal0, goal1;
    int max0, max1;
    int k0, k1;

    updateState(goal0, goal1, max0, max1, k0, k1);
    
    logger << "for odd with even measures: n0=" << goal0 << ", k=" << k0 << std::endl;
    logger << "for even with odd measures: n1=" << goal1 << ", k=" << k1 << std::endl;

    // for allocation, just use biggest k
    int big_k = k0 > k1 ? k0 : k1;

    // now create the data structure, for each vertex a PM
    pm_nodes = new int[big_k * nodecount()];
    strategy = new int[nodecount()];

    // initialize todo/dirty queues
    todo.resize(nodecount());
    dirty.resize(nodecount());

    lift_count = 0;
    lift_attempt = 0;

    if (bounded) {
        int i;
        for (i=1; i<=big_k; i++) {
            long _l = lift_count, _a = lift_attempt;
            uint64_t _c = game.count_unsolved();
            uint64_t c = _c;

            /*if (i <= k0)*/ {
                pl = 0;
                k = i;
                max = max0;
                maxo = max1 != -1 ? max1 : 0; // used in bump
                goal = goal0;
                liftloop();

                c = game.count_unsolved();
                logger << "after even with k=" << k << ", " << std::setw(9) << lift_count-_l << " lifts, " << std::setw(9) << lift_attempt-_a << " lift attempts, " << c << " unsolved left." << std::endl;
                if (c == 0) break;

                if (c != _c) updateState(goal0, goal1, max0, max1, k0, k1);
                _l = lift_count;
                _a = lift_attempt;
            }
            /*if (i <= k1)*/ {
                pl = 1;
                k = i;
                max = max1;
                maxo = max0 != -1 ? max0 : 1; // used in bump
                goal = goal1;
                liftloop();

                c = game.count_unsolved();
                logger << "after odd  with k=" << k << ", " << std::setw(9) << lift_count-_l << " lifts, " << std::setw(9) << lift_attempt-_a << " lift attempts, " << c << " unsolved left." << std::endl;
                if (c == 0) break;

                if (c != _c) updateState(goal0, goal1, max0, max1, k0, k1);
            }
            if (c != _c) i--;
        } 

        logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts, max k " << i << "." << std::endl;
    } else if (ODDFIRST) {
        pl = 1;
        k = k1;
        max = max1;
        maxo = max0 != -1 ? max0 : 1; // used in bump
        goal = goal1;
        liftloop();

        uint64_t c = game.count_unsolved();
        logger << "after odd, " << lift_count << " lifts, " << lift_attempt << " lift attempts, " << c << " unsolved left." << std::endl;

        if (c != 0) {
            updateState(goal0, goal1, max0, max1, k0, k1);

            pl = 0;
            k = k0;
            max = max0;
            maxo = max1 != -1 ? max1 : 0; // used in bump
            goal = goal0;
            liftloop();
        }

        logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts." << std::endl;
    } else {
        pl = 0;
        k = k0;
        max = max0;
        maxo = max1 != -1 ? max1 : 0; // used in bump
        goal = goal0;
        liftloop();

        uint64_t c = game.count_unsolved();
        logger << "after even, " << lift_count << " lifts, " << lift_attempt << " lift attempts, " << c << " unsolved left." << std::endl;

        if (c != 0) {
            updateState(goal0, goal1, max0, max1, k0, k1);

            pl = 1;
            k = k1;
            max = max1;
            maxo = max0 != -1 ? max0 : 1; // used in bump
            goal = goal1;
            liftloop();
        }

        logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts." << std::endl;
    }

    delete[] pm_nodes;
    delete[] strategy;
}